

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pe_crypto.cpp
# Opt level: O1

void __thiscall libtorrent::aux::rc4_handler::encrypt(rc4_handler *this,char *__block,int __edflag)

{
  rc4 *prVar1;
  long in_RCX;
  undefined4 in_register_00000014;
  undefined8 *puVar2;
  int iVar3;
  undefined8 *puVar4;
  span<char> *__begin2;
  
  puVar2 = (undefined8 *)CONCAT44(in_register_00000014,__edflag);
  if ((__block[0x218] == '\0') || (in_RCX == 0)) {
    (this->super_crypto_plugin)._vptr_crypto_plugin = (_func_int **)0x0;
    (this->m_rc4_incoming).x = 0;
    (this->m_rc4_incoming).y = 0;
    prVar1 = &this->m_rc4_incoming;
    (prVar1->buf).super_array<unsigned_char,_256UL>._M_elems[0] = '\0';
    (prVar1->buf).super_array<unsigned_char,_256UL>._M_elems[1] = '\0';
    (prVar1->buf).super_array<unsigned_char,_256UL>._M_elems[2] = '\0';
    (prVar1->buf).super_array<unsigned_char,_256UL>._M_elems[3] = '\0';
  }
  else {
    puVar4 = puVar2 + in_RCX * 2;
    iVar3 = 0;
    do {
      iVar3 = iVar3 + (int)puVar2[1];
      rc4_encrypt((uchar *)*puVar2,puVar2[1] & 0xffffffff,(rc4 *)(__block + 0x110));
      puVar2 = puVar2 + 2;
    } while (puVar2 != puVar4);
    (this->super_crypto_plugin)._vptr_crypto_plugin = (_func_int **)0x0;
    (this->m_rc4_incoming).x = 0;
    (this->m_rc4_incoming).y = 0;
    *(int *)(this->m_rc4_incoming).buf.super_array<unsigned_char,_256UL>._M_elems = iVar3;
  }
  return;
}

Assistant:

std::tuple<int, span<span<char const>>>
	rc4_handler::encrypt(span<span<char>> bufs)
	{
		span<span<char const>> empty;
		if (!m_encrypt) return std::make_tuple(0, empty);
		if (bufs.empty()) return std::make_tuple(0, empty);

		int bytes_processed = 0;
		for (auto& buf : bufs)
		{
			auto* const pos = reinterpret_cast<unsigned char*>(buf.data());
			int const len = int(buf.size());

			TORRENT_ASSERT(len >= 0);
			TORRENT_ASSERT(pos);

			bytes_processed += len;
			rc4_encrypt(pos, std::uint32_t(len), &m_rc4_outgoing);
		}
		return std::make_tuple(bytes_processed, empty);
	}